

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v5::internal::
     value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
     ::format_custom_arg<std::chrono::duration<int,std::ratio<1000000000000000000l,1l>>>
               (void *arg,
               basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
               *ctx)

{
  basic_parse_context<char,_fmt::v5::internal::error_handler> *this;
  iterator it;
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  *in_RSI;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *parse_ctx;
  type f;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *in_stack_00000308;
  duration *in_stack_00000310;
  formatter<std::chrono::duration<int,_std::ratio<1000000000000000000L,_1L>_>,_char,_void>
  *in_stack_00000318;
  formatter<std::chrono::duration<int,_std::ratio<1000000000000000000L,_1L>_>,_char,_void>
  *in_stack_ffffffffffffffa0;
  iterator in_stack_ffffffffffffffa8;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *in_stack_ffffffffffffffe0;
  formatter<std::chrono::duration<int,_std::ratio<1000000000000000000L,_1L>_>,_char,_void>
  *in_stack_ffffffffffffffe8;
  
  formatter<std::chrono::duration<int,_std::ratio<1000000000000000000L,_1L>_>,_char,_void>::
  formatter(in_stack_ffffffffffffffa0);
  this = context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
         ::parse_context(in_RSI);
  formatter<std::chrono::duration<int,_std::ratio<1000000000000000000L,_1L>_>,_char,_void>::parse
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to
            (this,in_stack_ffffffffffffffa8);
  it = formatter<std::chrono::duration<int,std::ratio<1000000000000000000l,1l>>,char,void>::
       format<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                 (in_stack_00000318,in_stack_00000310,in_stack_00000308);
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ::advance_to(in_RSI,it);
  return;
}

Assistant:

static void format_custom_arg(const void *arg, Context &ctx) {
    // Get the formatter type through the context to allow different contexts
    // have different extension points, e.g. `formatter<T>` for `format` and
    // `printf_formatter<T>` for `printf`.
    typename Context::template formatter_type<T>::type f;
    auto &&parse_ctx = ctx.parse_context();
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }